

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall
tonk::gateway::StateMachine::BeginControlSOAPRequests(StateMachine *this,int controlIndex)

{
  ostringstream *poVar1;
  undefined8 *puVar2;
  vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_> *this_00;
  int iVar3;
  pointer pCVar4;
  pointer pCVar5;
  HTTPRequester *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  SSDPRequester *pSVar6;
  bool bVar7;
  uint64_t nowUsec;
  OutputWorker *pOVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 local_1b8 [392];
  
  pCVar4 = (this->ControlEndpoints).
           super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  nowUsec = siamese::GetTimeUsec();
  this_00 = &pCVar4[controlIndex].Requests;
  uVar9 = (uint)((ulong)((long)(this->Requests).
                               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Requests).
                              super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (uVar9 != (int)((ulong)((long)(this_00->
                                   super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>::
    resize(this_00,(long)(int)uVar9);
  }
  if (0 < (int)uVar9) {
    lVar12 = 0x20;
    lVar11 = 4;
    uVar10 = 0;
    do {
      pCVar5 = (this_00->
               super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar3 = *(int *)((long)&((this->Requests).
                               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                               ._M_impl.super__Vector_impl_data._M_start)->LocalPort + lVar11);
      this_01 = *(HTTPRequester **)((long)pCVar5 + lVar12 + -0x18);
      if (this_01 == (HTTPRequester *)0x0) {
LAB_0013b8bd:
        if (*(int *)((long)pCVar5 + lVar12 + -0x20) == iVar3) {
LAB_0013b8c4:
          if (iVar3 != 0) goto LAB_0013bb31;
LAB_0013ba49:
          if ((((*(char *)((long)pCVar5 + lVar12 + -4) == '\x01') &&
               (*(short *)((long)pCVar5 + lVar12 + -6) != 0)) &&
              (170000000 < nowUsec - *(long *)((long)&pCVar5->LastApp + lVar12))) &&
             (*(undefined4 *)((long)pCVar5 + lVar12 + -0x1c) = 3, DAT_001b8e60 < 2)) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = ModuleLogger;
            local_1b8._8_4_ = Debug;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,DAT_001b8e90,DAT_001b8e98);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Time to renew the gateway port mapping for local:",0x31);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," <-> external:",0xe);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            pOVar8 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
LAB_0013bb19:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          }
        }
        else {
          *(int *)((long)pCVar5 + lVar12 + -0x20) = iVar3;
          if (iVar3 != 1) {
            if ((iVar3 != 0) || (*(short *)((long)pCVar5 + lVar12 + -6) != 0)) goto LAB_0013b8c4;
            *(undefined4 *)((long)pCVar5 + lVar12 + -0x1c) = 3;
            if (DAT_001b8e60 < 2) {
              poVar1 = (ostringstream *)(local_1b8 + 0x10);
              local_1b8._0_8_ = ModuleLogger;
              local_1b8._8_4_ = Debug;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,DAT_001b8e90,DAT_001b8e98);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Adding the gateway port mapping for local:",0x2a);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              pOVar8 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
            }
            goto LAB_0013ba49;
          }
          if (*(short *)((long)pCVar5 + lVar12 + -6) != 0) {
            *(undefined4 *)((long)pCVar5 + lVar12 + -0x1c) = 3;
            *(undefined1 *)((long)pCVar5 + lVar12 + -4) = 0;
            if (1 < DAT_001b8e60) goto LAB_0013bb31;
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = ModuleLogger;
            local_1b8._8_4_ = Debug;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,DAT_001b8e90,DAT_001b8e98);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Removing the gateway port mapping for local:",0x2c);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," <-> external:",0xe);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            pOVar8 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
            goto LAB_0013bb19;
          }
        }
LAB_0013bb31:
        pSVar6 = this->SSDP;
        if (pSVar6->HaveSeenAGatewayAddress == true) {
          if ((pSVar6->LAN).Gateway.type_ == ipv4) {
            if ((pSVar6->LAN).Gateway.ipv4_address_.addr_.s_addr != 0) goto LAB_0013bb71;
          }
          else if (((*(long *)&(pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u != 0) ||
                   ((int)*(undefined8 *)
                          ((long)&(pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u + 8) != 0)) ||
                  (((pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] != '\0' ||
                    (pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] != '\0' ||
                   (((pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] != '\0' ||
                    ((pSVar6->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] != '\0'))))))
          {
LAB_0013bb71:
            iVar3 = *(int *)((long)pCVar5 + lVar12 + -0x1c);
            if (0 < iVar3) {
              *(int *)((long)pCVar5 + lVar12 + -0x1c) = iVar3 + -1;
              RequestSOAP(this,controlIndex,(int)uVar10);
            }
          }
        }
      }
      else {
        bVar7 = HTTPRequester::OnTick_IsDisposable(this_01,nowUsec);
        if (bVar7) {
          this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)pCVar5 + lVar12 + -0x10);
          puVar2 = (undefined8 *)((long)pCVar5 + lVar12 + -0x18);
          *puVar2 = 0;
          puVar2[1] = 0;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
          goto LAB_0013b8bd;
        }
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x28;
      lVar11 = lVar11 + 0x10;
    } while ((uVar9 & 0x7fffffff) != uVar10);
  }
  return;
}

Assistant:

void StateMachine::BeginControlSOAPRequests(int controlIndex)
{
    ControlEndpoint& control = ControlEndpoints[controlIndex];

    // Get current time
    const uint64_t nowUsec = siamese::GetTimeUsec();

    // Resize requests
    const int requestCount = (int)Requests.size();
    if (requestCount != (int)control.Requests.size()) {
        control.Requests.resize(requestCount);
    }

    // Check each request
    for (int requestIndex = 0; requestIndex < requestCount; ++requestIndex)
    {
        ControlRequest& controlRequest = control.Requests[requestIndex];
        const AppRequest app = Requests[requestIndex];

        // If HTTP request is already in progress:
        if (nullptr != controlRequest.Requester)
        {
            // If the requester is dead:
            if (controlRequest.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                controlRequest.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // The application request type can fluctuate between Add/Remove at any time.

        // If the app request has changed:
        if (controlRequest.LastApp != app.Type)
        {
            controlRequest.LastApp = app.Type;

            if (app.Type == RequestType::Remove &&
                controlRequest.AddedExternalPort != 0)
            {
                // The app is requesting a remove and we had added a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                // Reset some state in case we want to add it again later
                controlRequest.AddAgainOnTimer = false;

                ModuleLogger.Debug("Removing the gateway port mapping for local:",
                    app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
            }
            else if (app.Type == RequestType::Add &&
                controlRequest.AddedExternalPort == 0)
            {
                // The app is requesting to add and we do not have a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                ModuleLogger.Debug("Adding the gateway port mapping for local:",
                    app.LocalPort);
            }
        }

        // If an external port was added successfully some time ago:
        if (app.Type == RequestType::Add &&
            controlRequest.AddAgainOnTimer &&
            controlRequest.AddedExternalPort != 0 &&
            nowUsec - controlRequest.LastSuccessUsec > protocol::kUPnPLeaseRenewSecs * 1000 * 1000)
        {
            /*
                Keep retrying forever after the lease renew interval elapses.

                This handles the case where the network goes down after a port
                is mapped, so the LAN info is still unchanged in Windows (same
                Local IP and same Gateway).  While the network is down, this
                causes continuous HTTP requests from the control endpoint about
                once per second until the uplink is restored or the LAN changes.

                LAN changes clear the AddAgainOnTimer flag to exit this loop.
            */
            controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

            ModuleLogger.Debug("Time to renew the gateway port mapping for local:",
                app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
        }

        // If the network is definitely down avoid sending queries:
        if (SSDP->IsNetworkDefinitelyDown()) {
            continue;
        }

        // If there are no more retries:
        if (controlRequest.RetriesRemaining <= 0) {
            continue; // Do not retry
        }
        controlRequest.RetriesRemaining--;

        // If retries are remaining then we should perform a request
        RequestSOAP(controlIndex, requestIndex);
    }
}